

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void name_public_cb(Fl_Choice *i,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Class_Type *pFVar3;
  Fl_Type *local_28;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    Fl_Choice::value(i,(uint)(0 < current_widget->public_));
    pFVar3 = Fl_Type::is_in_class(&current_widget->super_Fl_Type);
    if (pFVar3 == (Fl_Class_Type *)0x0) {
      (*(i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
    }
    else {
      (*(i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
    }
  }
  else {
    bVar1 = false;
    for (local_28 = Fl_Type::first; local_28 != (Fl_Type *)0x0; local_28 = local_28->next) {
      if ((local_28->selected != '\0') && (iVar2 = (*local_28->_vptr_Fl_Type[0x17])(), iVar2 != 0))
      {
        iVar2 = Fl_Choice::value(i);
        *(int *)&local_28[1].factory = iVar2;
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
      redraw_browser();
    }
  }
  return;
}

Assistant:

void name_public_cb(Fl_Choice* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->public_>0);
    if (current_widget->is_in_class()) i->hide(); else i->show();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	((Fl_Widget_Type*)o)->public_ = i->value();
	mod = 1;
      }
    }
    if (mod) {
      set_modflag(1);
      redraw_browser();
    }
  }
}